

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

void __thiscall EventLoop::unregisterSocket(EventLoop *this,int fd)

{
  _Rb_tree_header *p_Var1;
  uint __errnum;
  FILE *__stream;
  int iVar2;
  _Base_ptr p_Var3;
  uint *puVar4;
  iterator __position;
  epoll_event ev;
  epoll_event local_58;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar2 == 0) {
    p_Var3 = (this->mSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var3 != (_Base_ptr)0x0) {
      p_Var1 = &(this->mSockets)._M_t._M_impl.super__Rb_tree_header;
      __position._M_node = &p_Var1->_M_header;
      do {
        if (fd <= (int)p_Var3[1]._M_color) {
          __position._M_node = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < fd];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
         ((int)__position._M_node[1]._M_color <= fd)) {
        std::
        _Rb_tree<int,std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>,std::_Select1st<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>>
        ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>,std::_Select1st<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<unsigned_int,std::function<void(int,unsigned_int)>>>>>
                            *)&this->mSockets,__position);
        local_58.data.fd = 0;
        local_58.events = 0;
        local_58._4_4_ = 0;
        iVar2 = epoll_ctl(this->mPollFd,2,fd,&local_58);
        if (iVar2 == -1) {
          puVar4 = (uint *)__errno_location();
          __stream = _stderr;
          __errnum = *puVar4;
          if (__errnum != 2) {
            Rct::strerror((Rct *)local_48,__errnum);
            fprintf(__stream,"Unable to unregister socket %d: %d (%s)\n",fd,(ulong)__errnum,
                    local_48[0]);
            if (local_48[0] != local_38) {
              operator_delete(local_48[0]);
            }
          }
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void EventLoop::unregisterSocket(int fd)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end())
        return;
#ifdef HAVE_KQUEUE
    const int mode = socket->second.first;
#endif
    mSockets.erase(socket);

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    e = epoll_ctl(mPollFd, EPOLL_CTL_DEL, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        ev.flags = EV_DELETE|EV_DISABLE;
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != ENOENT) {
            fprintf(stderr, "Unable to unregister socket %d: %d (%s)\n",
                    fd, errno, Rct::strerror().constData());
        }
    }
}